

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

module * __thiscall
pybind11::module::
def<std::pair<std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>(*)(anurbs::CurveBase<2l>const&,double),pybind11::arg,pybind11::arg_v>
          (module *this,char *name_,
          _func_pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_CurveBase<2L>_ptr_double
          **f,arg *extra,arg_v *extra_1)

{
  _func_pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_CurveBase<2L>_ptr_double
  *f_00;
  cpp_function func;
  handle local_60;
  handle local_58;
  object local_50;
  handle local_48;
  name local_40;
  sibling local_38;
  
  f_00 = *f;
  local_48.m_ptr = (this->super_object).super_handle.m_ptr;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40.value = name_;
  local_60.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_60.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_38.value.m_ptr = (handle)(handle)local_60.m_ptr;
  cpp_function::
  cpp_function<std::pair<std::vector<double,std::allocator<double>>,std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>,anurbs::CurveBase<2l>const&,double,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg_v>
            ((cpp_function *)&local_58,f_00,&local_40,(scope *)&local_48,&local_38,extra,extra_1);
  object::~object((object *)&local_60);
  object::~object(&local_50);
  add_object(this,name_,local_58,true);
  object::~object((object *)&local_58);
  return this;
}

Assistant:

module &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }